

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bssplitscb(bStream *s,const_bstring splitStr,_func_int_void_ptr_int_const_bstring *cb,void *parm
              )

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  bstring r;
  int iVar5;
  uint uVar6;
  tagbstring t;
  charField chrs;
  uint uVar7;
  
  if (s == (bStream *)0x0 || cb == (_func_int_void_ptr_int_const_bstring *)0x0) {
    return -1;
  }
  if (splitStr == (const_bstring)0x0) {
    return -1;
  }
  if (s->readFnPtr == (bNread)0x0) {
    return -1;
  }
  if (splitStr->slen < 0) {
    return -1;
  }
  r = bfromcstr(anon_var_dwarf_2f785 + 0x10);
  if (r == (bstring)0x0) {
    return -1;
  }
  if (splitStr->slen != 0) {
    buildCharField(&chrs,splitStr);
    iVar3 = r->slen;
    uVar6 = 0;
    iVar5 = 0;
    do {
      if (iVar3 <= (int)uVar6) {
        bsreada(r,s,0x100);
        iVar3 = r->slen;
        if (iVar3 <= (int)uVar6) goto LAB_00147ca1;
      }
      bVar1 = r->data[(int)uVar6];
      uVar7 = uVar6;
      if ((chrs.content[bVar1 >> 3] >> (bVar1 & 7) & 1) != 0) {
        t.data = r->data + (long)(int)uVar6 + 1;
        t.slen = iVar3 - (uVar6 + 1);
        t.mlen = -1;
        iVar3 = bsunread(s,&t);
        uVar7 = 0xffffffff;
        uVar4 = uVar7;
        if (iVar3 < 0) goto LAB_00147cb6;
        r->slen = uVar6;
        uVar2 = r->data[(int)uVar6];
        r->data[(int)uVar6] = '\0';
        uVar4 = (*cb)(parm,iVar5,r);
        if ((int)uVar4 < 0) goto LAB_00147cb6;
        r->data[(int)uVar6] = uVar2;
        r->slen = 0;
        iVar5 = iVar5 + uVar6 + 1;
        iVar3 = 0;
      }
      uVar6 = uVar7 + 1;
    } while( true );
  }
  do {
    iVar3 = bsreada(r,s,0x100);
  } while (-1 < iVar3);
  uVar6 = (*cb)(parm,0,r);
LAB_00147caf:
  uVar4 = (int)uVar6 >> 0x1f & uVar6;
LAB_00147cb6:
  bdestroy(r);
  return uVar4;
LAB_00147ca1:
  uVar6 = (*cb)(parm,iVar5,r);
  goto LAB_00147caf;
}

Assistant:

int bssplitscb (struct bStream * s, const_bstring splitStr,
	int (* cb) (void * parm, int ofs, const_bstring entry), void * parm) {
	struct charField chrs;
	bstring buff;
	int i = 0, p = 0, ret = 0;

	if (cb == NULL || s == NULL || s->readFnPtr == NULL ||
	    splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (NULL == (buff = bfromcstr (""))) return BSTR_ERR;

	if (splitStr->slen == 0) {
		while (bsreada (buff, s, BSSSC_BUFF_LEN) >= 0) ;
		if ((ret = cb (parm, 0, buff)) > 0)
			ret = 0;
	} else {
		buildCharField (&chrs, splitStr);
		for (;;) {
			if (i >= buff->slen) {
				bsreada (buff, s, BSSSC_BUFF_LEN);
				if (i >= buff->slen) {
					if (0 < (ret = cb (parm, p, buff))) ret = 0;
					break;
				}
			}
			if (testInCharField (&chrs, buff->data[i])) {
				struct tagbstring t;
				unsigned char c;

				blk2tbstr (t, buff->data + i + 1, buff->slen - (i + 1));
				if ((ret = bsunread (s, &t)) < 0) break;
				buff->slen = i;
				c = buff->data[i];
				buff->data[i] = (unsigned char) '\0';
				if ((ret = cb (parm, p, buff)) < 0) break;
				buff->data[i] = c;
				buff->slen = 0;
				p += i + 1;
				i = -1;
			}
			i++;
		}
	}

	bdestroy (buff);
	return ret;
}